

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_mulhsu(TCGContext_conflict11 *tcg_ctx,TCGv_i64 ret,TCGv_i64 arg1,TCGv_i64 arg2)

{
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGv_i64 rl;
  uintptr_t o;
  
  ts = tcg_temp_new_internal_riscv64(tcg_ctx,TCG_TYPE_I64,false);
  rl = (TCGv_i64)((long)ts - (long)tcg_ctx);
  ts_00 = tcg_temp_new_internal_riscv64(tcg_ctx,TCG_TYPE_I64,false);
  tcg_gen_mulu2_i64_riscv64(tcg_ctx,rl,(TCGv_i64)((long)ts_00 - (long)tcg_ctx),arg1,arg2);
  tcg_gen_sari_i64_riscv64(tcg_ctx,rl,arg1,0x3f);
  tcg_gen_op3_riscv64(tcg_ctx,INDEX_op_and_i64,(TCGArg)ts,(TCGArg)ts,(TCGArg)(arg2 + (long)tcg_ctx))
  ;
  tcg_gen_sub_i64(tcg_ctx,ret,(TCGv_i64)((long)ts_00 - (long)tcg_ctx),rl);
  tcg_temp_free_internal_riscv64(tcg_ctx,ts);
  tcg_temp_free_internal_riscv64(tcg_ctx,ts_00);
  return;
}

Assistant:

static void gen_mulhsu(TCGContext *tcg_ctx, TCGv ret, TCGv arg1, TCGv arg2)
{
    TCGv rl = tcg_temp_new(tcg_ctx);
    TCGv rh = tcg_temp_new(tcg_ctx);

    tcg_gen_mulu2_tl(tcg_ctx, rl, rh, arg1, arg2);
    /* fix up for one negative */
    tcg_gen_sari_tl(tcg_ctx, rl, arg1, TARGET_LONG_BITS - 1);
    tcg_gen_and_tl(tcg_ctx, rl, rl, arg2);
    tcg_gen_sub_tl(tcg_ctx, ret, rh, rl);

    tcg_temp_free(tcg_ctx, rl);
    tcg_temp_free(tcg_ctx, rh);
}